

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcActor::IfcActor(IfcActor *this,void **vtt)

{
  void **vtt_local;
  IfcActor *this_local;
  
  IfcObject::IfcObject(&this->super_IfcObject,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcActor,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcActor,_1UL> *)
             &(this->super_IfcObject).field_0xd0,vtt + 0x10);
  *(void **)&this->super_IfcObject = *vtt;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18)
            ) = vtt[0x12];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0x13];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcObject).field_0xd0 = vtt[0x15];
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)
             &(this->super_IfcObject).field_0xe0);
  return;
}

Assistant:

IfcActor() : Object("IfcActor") {}